

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool LTFlightData::CheckDupKey(FDKeyTy *_key,FDKeyType _ty)

{
  logLevelTy lVar1;
  size_type sVar2;
  char *pcVar3;
  FDKeyTy *in_RDI;
  FDKeyTy cpyKey;
  FDKeyTy *in_stack_ffffffffffffff68;
  FDKeyTy *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff78;
  map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  *in_stack_ffffffffffffff80;
  unsigned_long in_stack_ffffffffffffffa0;
  FDKeyType in_stack_ffffffffffffffac;
  FDKeyTy *in_stack_ffffffffffffffb0;
  FDKeyTy local_48;
  FDKeyTy *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  FDKeyTy::FDKeyTy(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
  sVar2 = std::
          map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
          ::count(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (sVar2 == 0) {
    local_1 = 0;
  }
  else {
    lVar1 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar1 < 1) {
      pcVar3 = FDKeyTy::c_str((FDKeyTy *)0x1d1b3c);
      in_stack_ffffffffffffff68 = (FDKeyTy *)FDKeyTy::GetKeyTypeText(local_10);
      in_stack_ffffffffffffff70 = (FDKeyTy *)FDKeyTy::GetKeyTypeText(&local_48);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
             ,0x1a6,"CheckDupKey",logDEBUG,
             "Handling same key %s of different types: %s replaced by %s",pcVar3);
    }
    FDKeyTy::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_1 = 1;
  }
  FDKeyTy::~FDKeyTy((FDKeyTy *)0x1d1bf5);
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::CheckDupKey(LTFlightData::FDKeyTy& _key, LTFlightData::FDKeyType _ty)
{
    LTFlightData::FDKeyTy cpyKey(_ty, _key.num);
    if (mapFd.count(cpyKey) > 0) {
        LOG_MSG(logDEBUG, "Handling same key %s of different types: %s replaced by %s",
                _key.c_str(), _key.GetKeyTypeText(), cpyKey.GetKeyTypeText());
        _key = std::move(cpyKey);
        return true;
    }
    return false;
}